

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_process_qcc(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *pjVar1;
  jpc_msparms_t *qcc_00;
  jpc_dec_tile_t *tile;
  jpc_qcc_t *qcc;
  jpc_ms_t *ms_local;
  jpc_dec_t *dec_local;
  
  qcc_00 = &ms->parms;
  if (dec->numcomps <= (int)(qcc_00->sot).tileno) {
    jas_eprintf("invalid component number in QCC marker segment\n");
    return -1;
  }
  if (dec->state == 4) {
    jpc_dec_cp_setfromqcc(dec->cp,&qcc_00->qcc);
  }
  else if (dec->state == 0x10) {
    pjVar1 = dec->curtile;
    if (pjVar1 == (jpc_dec_tile_t *)0x0) {
      return -1;
    }
    if (0 < pjVar1->partno) {
      return -1;
    }
    jpc_dec_cp_setfromqcc(pjVar1->cp,&qcc_00->qcc);
  }
  return 0;
}

Assistant:

static int jpc_dec_process_qcc(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	jpc_dec_tile_t *tile;

	if (JAS_CAST(int, qcc->compno) >= dec->numcomps) {
		jas_eprintf("invalid component number in QCC marker segment\n");
		return -1;
	}
	switch (dec->state) {
	case JPC_MH:
		jpc_dec_cp_setfromqcc(dec->cp, qcc);
		break;
	case JPC_TPH:
		if (!(tile = dec->curtile)) {
			return -1;
		}
		if (tile->partno > 0) {
			return -1;
		}
		jpc_dec_cp_setfromqcc(tile->cp, qcc);
		break;
	}
	return 0;
}